

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

bool __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::StringOffsetCompare::operator()
          (StringOffsetCompare *this,Offset<flatbuffers::String> *a,Offset<flatbuffers::String> *b)

{
  uint8_t *puVar1;
  size_t sVar2;
  bool bVar3;
  uoffset_t *puVar4;
  uoffset_t *puVar5;
  
  puVar1 = this->buf_->buf_;
  sVar2 = this->buf_->reserved_;
  puVar5 = (uoffset_t *)(puVar1 + (sVar2 - a->o));
  puVar4 = (uoffset_t *)(puVar1 + (sVar2 - b->o));
  bVar3 = StringLessThan((char *)(puVar5 + 1),*puVar5,(char *)(puVar4 + 1),*puVar4);
  return bVar3;
}

Assistant:

bool operator()(const Offset<String> &a, const Offset<String> &b) const {
      auto stra = reinterpret_cast<const String *>(buf_->data_at(a.o));
      auto strb = reinterpret_cast<const String *>(buf_->data_at(b.o));
      return StringLessThan(stra->data(), stra->size(), strb->data(),
                            strb->size());
    }